

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_accessor_2.cpp
# Opt level: O3

ssize_t __thiscall
UDPAddrPacketReader::recv(UDPAddrPacketReader *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  string *__return_storage_ptr__;
  undefined4 in_register_00000034;
  socklen_t addrlen;
  socklen_t local_14;
  
  sVar1 = recvfrom(*(int *)&(this->super_UDPPacketReader).super_BufferReader.field_0x28,
                   (void *)CONCAT44(in_register_00000034,__fd),(long)(int)__buf,0,
                   (sockaddr *)&(this->super_UDPPacketReader).super_BufferReader.field_0x2c,
                   &local_14);
  if (-1 < (int)sVar1) {
    return sVar1;
  }
  (this->super_UDPPacketReader).super_BufferReader.super_Buffer.buf_current =
       (this->super_UDPPacketReader).super_BufferReader.super_Buffer.buf_start;
  __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
  sock_error_string_abi_cxx11_(__return_storage_ptr__,"UDPAddrPacketReader::recv()");
  __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

int UDPAddrPacketReader::recv(void *data, int length) {
  socklen_t addrlen = sizeof(reply_addr);
  if ((length = ::recvfrom(socket, (char *) data, length, 0, (struct sockaddr *) &reply_addr, &addrlen)) < 0) {
    buf_current = buf_start;
    throw sock_error_string("UDPAddrPacketReader::recv()");
  }
  return length;
}